

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O3

conversion_result mjs::unicode::utf16_to_utf32<wchar_t>(wchar_t *src,uint max_length)

{
  wchar_t wVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  if (max_length == 0) {
    __assert_fail("max_length != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                  ,0x78,
                  "conversion_result mjs::unicode::utf16_to_utf32(const CharT *, unsigned int) [CharT = wchar_t]"
                 );
  }
  wVar1 = *src;
  uVar2 = 0;
  uVar4 = ((uint)(wVar1 & 0xffffU) < 0xdc00) - 1 | 1;
  if ((uint)(wVar1 + L'\x2000' & 0xffffU) < 0xf800) {
    uVar4 = 0;
  }
  if (uVar4 < max_length) {
    if ((uint)(wVar1 + L'\x2000' & 0xffffU) < 0xf800) {
      uVar2 = (ulong)(uint)(wVar1 & 0xffff);
      uVar3 = 1;
    }
    else {
      if ((wVar1 & 0xfc00U) != 0xd800) {
        __assert_fail("first_code_unit >= utf16_high_surrogate && first_code_unit < utf16_low_surrogate"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/char_conversions.h"
                      ,0x85,
                      "conversion_result mjs::unicode::utf16_to_utf32(const CharT *, unsigned int) [CharT = wchar_t]"
                     );
      }
      bVar5 = 0xfffffbff < (ushort)src[1] - 0xe000;
      uVar2 = (ulong)(uint)((wVar1 & 0xdbffU) * 0x400 + -0x35fdc00 + (uint)(ushort)src[1]);
      if (!bVar5) {
        uVar2 = 0;
      }
      uVar3 = (ulong)((uint)bVar5 * 2);
    }
  }
  else {
    uVar3 = 0;
  }
  return (conversion_result)(uVar2 << 0x20 | uVar3);
}

Assistant:

constexpr conversion_result utf16_to_utf32(const CharT* src, unsigned max_length) {
    static_assert(sizeof(CharT) >= sizeof(char16_t));
    assert(max_length != 0);
    const auto first_code_unit = static_cast<char16_t>(src[0]);
    const auto l = utf16_length_from_lead_code_unit(first_code_unit);
    if (!l) {
        // Invalid leading byte
        return invalid_conversion;
    } else if (l > max_length) {
        // Not enough source characters
        return invalid_conversion;
    } else if (l == 1) {
        // Simple case
        return { 1, first_code_unit };
    }
    assert(first_code_unit >= utf16_high_surrogate && first_code_unit < utf16_low_surrogate);
    const auto second_code_unit = static_cast<char16_t>(src[1]);
    if (second_code_unit < utf16_low_surrogate || second_code_unit > utf16_last_surrogate) {
        // Invalid surrogate pair
        return invalid_conversion;
    }

    return { 2, static_cast<char32_t>(0x10000 + ((first_code_unit - utf16_high_surrogate) << 10) + (second_code_unit - utf16_low_surrogate)) };
}